

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O1

void __thiscall
Clasp::SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *this,BlockLimit *x)

{
  BlockLimit *this_00;
  
  this_00 = (BlockLimit *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && this_00 != x) &&
     (this->ptr_ = (uintp)this_00, this_00 != (BlockLimit *)0x0)) {
    MovingAvg::~MovingAvg((MovingAvg *)this_00);
    operator_delete(this_00);
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}